

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphStatistics.cpp
# Opt level: O0

void __thiscall floorplan::GraphStatistics::generateCategoryCountDist(GraphStatistics *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference __k;
  mapped_type *pmVar4;
  vector<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
  *pvVar5;
  const_reference x;
  reference ppvVar6;
  vertex_bundled *__k_00;
  reference pvVar7;
  pair<std::_List_iterator<void_*>,_std::_List_iterator<void_*>_> pVar8;
  vertex_descriptor v;
  pair<std::_List_iterator<void_*>,_std::_List_iterator<void_*>_> bgl_range_88;
  floorplanGraph G;
  uint i_1;
  allocator<double> local_39;
  value_type_conflict local_38;
  vector<double,_std::allocator<double>_> local_30;
  uint local_14;
  GraphStatistics *pGStack_10;
  uint i;
  GraphStatistics *this_local;
  
  pGStack_10 = this;
  for (local_14 = 0; uVar2 = (ulong)local_14,
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->_labels), uVar2 < sVar3; local_14 = local_14 + 1) {
    local_38 = 0.0;
    std::allocator<double>::allocator(&local_39);
    std::vector<double,_std::allocator<double>_>::vector(&local_30,1,&local_38,&local_39);
    __k = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&this->_labels,(ulong)local_14);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
             ::operator[](&this->_categoryCountDistByLabel,__k);
    std::vector<double,_std::allocator<double>_>::operator=(pmVar4,&local_30);
    std::vector<double,_std::allocator<double>_>::~vector(&local_30);
    std::allocator<double>::~allocator(&local_39);
  }
  G.m_property.px._0_4_ = 0;
  while( true ) {
    pvVar5 = GraphDatabase::getGraphs(this->_database);
    sVar3 = std::
            vector<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
            ::size(pvVar5);
    if (sVar3 <= (uint)G.m_property.px) break;
    pvVar5 = GraphDatabase::getGraphs(this->_database);
    x = std::
        vector<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_std::allocator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>_>_>
        ::operator[](pvVar5,(ulong)(uint)G.m_property.px);
    boost::
    adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
    ::adjacency_list((adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                      *)&bgl_range_88.second,x);
    pVar8 = boost::
            vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>,boost::listS,boost::listS,boost::undirectedS,Space,spaceEdge,graphProperties,boost::listS>::config>>
                      ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>::config>_>
                        *)&bgl_range_88.second);
    while( true ) {
      bgl_range_88.first = pVar8.second._M_node;
      v = (vertex_descriptor)pVar8.first._M_node;
      bVar1 = std::operator!=((_Self *)&v,&bgl_range_88.first);
      if (!bVar1) break;
      while (bVar1 = std::operator!=((_Self *)&v,&bgl_range_88.first), bVar1) {
        ppvVar6 = std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)&v);
        __k_00 = boost::
                 adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                 ::operator[]((adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                               *)&bgl_range_88.second,*ppvVar6);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
                 ::operator[](&this->_categoryCountDistByLabel,&__k_00->category);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pmVar4,0);
        *pvVar7 = *pvVar7 + 1.0;
        std::_List_iterator<void_*>::operator++((_List_iterator<void_*> *)&v);
      }
      pVar8.second._M_node = bgl_range_88.first._M_node;
      pVar8.first._M_node = bgl_range_88.first._M_node;
    }
    boost::
    adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
    ::~adjacency_list((adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_Space,_spaceEdge,_graphProperties,_boost::listS>
                       *)&bgl_range_88.second);
    G.m_property.px._0_4_ = (uint)G.m_property.px + 1;
  }
  return;
}

Assistant:

void GraphStatistics::generateCategoryCountDist(){
    for(unsigned int i = 0; i < _labels.size(); i++)
        _categoryCountDistByLabel[_labels[i]] = vector<double>(1, 0);

    /* Fill up the labels and categoryCount container */
    for (unsigned int i = 0; i < _database->getGraphs().size(); i++){
        floorplanGraph G = _database->getGraphs()[i];
        BGL_FORALL_VERTICES(v, G, floorplanGraph){
            _categoryCountDistByLabel[G[v].category][0]++;
        }
    }
}